

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cpp
# Opt level: O3

void __thiscall
DSDcc::CRC::CRC(CRC *this,unsigned_long polynomial,int order,unsigned_long crcinit,
               unsigned_long crcxor,int direct,int refin,int refout)

{
  byte bVar1;
  
  this->m_order = order;
  this->m_poly = polynomial;
  this->m_direct = direct;
  this->m_crcinit = crcinit;
  this->m_crcxor = crcxor;
  this->m_refin = refin;
  this->m_refout = refout;
  bVar1 = (char)order - 1;
  this->m_crcmask = ~(-1L << (bVar1 & 0x3f)) * 2 + 1;
  this->m_crchighbit = 1L << (bVar1 & 0x3f);
  generate_crc_table(this);
  init(this,(EVP_PKEY_CTX *)polynomial);
  return;
}

Assistant:

CRC::CRC(unsigned long polynomial,
            int order,
            unsigned long crcinit,
            unsigned long crcxor,
            int direct,
            int refin,
            int refout) :
        m_order(order),
        m_poly(polynomial),
        m_direct(direct),
        m_crcinit(crcinit),
        m_crcxor(crcxor),
        m_refin(refin),
        m_refout(refout)
{
    m_crcmask = ((((unsigned long) 1 << (m_order - 1)) - 1) << 1) | 1;
    m_crchighbit = (unsigned long) 1 << (m_order - 1);

    generate_crc_table();
    init();
}